

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *
trompeloeil::find<std::reference_wrapper<int>&(std::reference_wrapper<int>&)>
          (call_matcher_list<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *list,
          call_params_type_t<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *p)

{
  int iVar1;
  uint uVar2;
  call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *pcVar3;
  uint uVar4;
  call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *pcVar5;
  
  pcVar5 = (call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *)
           (list->
           super_list<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>,_trompeloeil::ignore_disposer>
           ).
           super_list_elem<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
           .next;
  if (pcVar5 == (call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *)
                list) {
    pcVar3 = (call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *)0x0;
  }
  else {
    uVar4 = 0xffffffff;
    pcVar3 = (call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *)0x0;
    do {
      iVar1 = (*(pcVar5->
                super_list_elem<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
                )._vptr_list_elem[3])(pcVar5,p);
      if ((char)iVar1 != '\0') {
        uVar2 = (*(pcVar5->
                  super_list_elem<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
                  )._vptr_list_elem[4])(pcVar5);
        if (uVar2 == 0) {
          return pcVar5;
        }
        if (uVar2 < uVar4 ||
            pcVar3 == (call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>
                       *)0x0) {
          pcVar3 = pcVar5;
          uVar4 = uVar2;
        }
      }
      pcVar5 = (call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *)
               (pcVar5->
               super_list_elem<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
               ).next;
    } while (pcVar5 != (call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>
                        *)list);
  }
  return pcVar3;
}

Assistant:

call_matcher_base <Sig> *
  find(
    call_matcher_list <Sig> &list,
    call_params_type_t <Sig> const &p)
  noexcept
  {
    call_matcher_base<Sig>* first_match = nullptr;
    unsigned lowest_cost = ~0U;
    for (auto& i : list)
    {
      if (i.matches(p))
      {
        unsigned cost = i.sequence_cost();
        if (cost == 0)
        {
          return &i;
        }
        if (!first_match || cost < lowest_cost)
        {
          first_match = &i;
          lowest_cost = cost;
        }
      }
    }
    return first_match;
  }